

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O3

Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readMapping_abi_cxx11_
          (Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_48_2_9b3c4038_for_Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  undefined4 uVar6;
  _Alloc_hider _Var7;
  undefined1 auVar8 [8];
  _Alloc_hider _Var9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  YamlEvent event;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  YamlEvent event_1;
  string key;
  Mapping mapping;
  undefined1 local_130 [16];
  undefined1 local_120 [24];
  bool local_108;
  undefined1 local_100 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e8;
  undefined1 local_d8;
  bool local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  anon_union_48_2_9b3c4038_for_Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_60;
  
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_60 + 8);
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_120 + 8);
  _Var9._M_p = (pointer)&aStack_e8;
  _Var7._M_p = local_120 + 8;
  local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_100,this);
    if (local_d8 == 0) break;
    local_130._0_4_ = local_100._0_4_;
    if ((pointer)local_100._8_8_ == _Var9._M_p) {
      local_120._8_8_ = aStack_e8._0_8_;
      local_120._16_4_ = aStack_e8._8_4_;
      local_120._20_4_ = aStack_e8._12_4_;
      local_130._8_8_ = paVar2;
    }
    else {
      local_120._8_8_ = aStack_e8._0_8_;
      local_130._8_8_ = local_100._8_8_;
    }
    local_120._8_8_ = aStack_e8._0_8_;
    local_120._0_8_ = local_100._16_8_;
    local_100._16_8_ = (_Base_ptr)0x0;
    aStack_e8._0_8_ = aStack_e8._0_8_ & 0xffffffffffffff00;
    local_100._8_8_ = _Var9._M_p;
    if (local_100._0_4_ != 6) {
      if (local_100._0_4_ == 10) {
        uVar5 = (long)&__return_storage_ptr__->field_0 + 8;
        if (local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = 0;
          paVar3 = &__return_storage_ptr__->field_0;
          uVar6 = _S_red;
          uVar10 = uVar5;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               (size_type)
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               (_Base_ptr)uVar5;
          *(size_t *)((long)&__return_storage_ptr__->field_0 + 0x28) =
               local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          paVar3 = &local_60;
          uVar5 = local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          uVar10 = local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          uVar6 = local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&local_60 + 8);
          local_60.value_.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)((long)&local_60 + 8);
        }
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = uVar5;
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x20) = uVar10;
        *(undefined8 *)((long)paVar3 + 0x28) = 0;
        *(undefined4 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar6;
        __return_storage_ptr__->has_value_ = true;
      }
      else {
        format_abi_cxx11_(&local_80,"Unexpected event %d");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          aStack_b0._M_allocated_capacity = local_80.field_2._8_8_;
          _Var7._M_p = (pointer)(local_c0 + 8);
        }
        else {
          local_c8 = (undefined1  [8])local_80._M_dataplus._M_p;
          _Var7._M_p = local_80._M_dataplus._M_p;
        }
        local_c0._8_8_ = local_80.field_2._M_allocated_capacity;
        paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var7._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_c0 + 8)) {
          paVar1->_M_allocated_capacity = local_80.field_2._M_allocated_capacity;
          *(size_type *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               aStack_b0._M_allocated_capacity;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = _Var7._M_p;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_80.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_80._M_string_length
        ;
        __return_storage_ptr__->has_value_ = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._8_8_ != paVar2) {
        operator_delete((void *)local_130._8_8_,local_120._8_8_ + 1);
      }
      if (local_d8 != 1) goto LAB_001493b7;
      goto LAB_00149489;
    }
    std::__cxx11::string::operator=((string *)&local_a0,(string *)(local_130 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._8_8_ != paVar2) {
      operator_delete((void *)local_130._8_8_,local_120._8_8_ + 1);
    }
    if (local_d8 == 1) {
      _Var4._M_p = _Var9._M_p;
      _Var11._M_p = (pointer)local_100._8_8_;
      if ((pointer)local_100._8_8_ != _Var9._M_p) {
LAB_00149085:
        operator_delete(_Var11._M_p,*(size_type *)_Var4._M_p + 1);
      }
    }
    else {
      _Var4._M_p = local_100 + 0x10;
      _Var11._M_p = (pointer)local_100._0_8_;
      if ((pointer)local_100._0_8_ != _Var4._M_p) goto LAB_00149085;
    }
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_130,this);
    if (local_108 == false) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "Error while reading mapping: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
      ;
      if (local_c8 == (undefined1  [8])(local_c0 + 8)) {
        local_100._16_8_ = local_c0._8_8_;
        aStack_e8._0_8_ = aStack_b0._M_allocated_capacity;
        auVar8 = (undefined1  [8])(local_100 + 0x10);
      }
      else {
        local_100._0_8_ = local_c8;
        local_100._16_8_ = local_c0._8_8_;
        auVar8 = local_c8;
      }
      local_100._16_8_ = local_c0._8_8_;
      paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = paVar2;
      if (auVar8 == (undefined1  [8])(local_100 + 0x10)) {
        paVar2->_M_allocated_capacity = local_c0._8_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             aStack_e8._0_8_;
      }
      else {
        *(undefined1 (*) [8])&__return_storage_ptr__->field_0 = auVar8;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             local_c0._8_8_;
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_c0._0_8_;
      __return_storage_ptr__->has_value_ = false;
      if ((local_108 & 1U) == 0) {
LAB_00149690:
        _Var7._M_p = local_120;
        _Var9._M_p = (pointer)local_130._0_8_;
        if ((pointer)local_130._0_8_ != _Var7._M_p) {
LAB_001496a2:
          operator_delete(_Var9._M_p,*(size_type *)_Var7._M_p + 1);
        }
      }
      else {
LAB_001494e1:
        _Var9._M_p = (pointer)local_130._8_8_;
        if ((pointer)local_130._8_8_ != _Var7._M_p) goto LAB_001496a2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001496d6;
    }
    local_c8._0_4_ = local_130._0_4_;
    local_c0._0_8_ = &aStack_b0;
    if ((pointer)local_130._8_8_ == _Var7._M_p) {
      aStack_b0._8_4_ = local_120._16_4_;
      aStack_b0._12_4_ = local_120._20_4_;
    }
    else {
      local_c0._0_8_ = local_130._8_8_;
    }
    aStack_b0._M_allocated_capacity = local_120._8_8_;
    local_c0._8_8_ = local_120._0_8_;
    local_120._0_8_ = (_Base_ptr)0x0;
    local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
    local_130._8_8_ = _Var7._M_p;
    if (local_130._0_4_ == YAML_MAPPING_START_EVENT) {
      readMapping_abi_cxx11_
                ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_100,this);
      if (local_d0 == false) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_100._0_8_,(pointer)(local_100._8_8_ + local_100._0_8_))
        ;
        paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          paVar2->_M_allocated_capacity = local_80.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               local_80.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
               local_80._M_dataplus._M_p;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_80.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_80._M_string_length
        ;
        __return_storage_ptr__->has_value_ = false;
        Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_100);
        goto LAB_00149663;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
      ::_M_emplace_unique<std::__cxx11::string,yaml::Mapping>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                  *)&local_60.value_,&local_a0,(Mapping *)local_100);
      Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
    }
    else if (local_130._0_4_ == YAML_SEQUENCE_START_EVENT) {
      readSequence_abi_cxx11_
                ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_100,this);
      if (aStack_e8._M_local_buf[8] == '\0') {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_100._0_8_,(pointer)(local_100._8_8_ + local_100._0_8_))
        ;
        paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          paVar2->_M_allocated_capacity = local_80.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               local_80.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p =
               local_80._M_dataplus._M_p;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_80.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_80._M_string_length
        ;
        __return_storage_ptr__->has_value_ = false;
        Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_100);
        goto LAB_00149663;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
      ::_M_emplace_unique<std::__cxx11::string,std::vector<yaml::Value,std::allocator<yaml::Value>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                  *)&local_60.value_,&local_a0,
                 (vector<yaml::Value,_std::allocator<yaml::Value>_> *)local_100);
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_100);
    }
    else {
      if (local_130._0_4_ != YAML_SCALAR_EVENT) {
        format_abi_cxx11_(&local_80,"Unexpected event %d");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          local_100._16_8_ = local_80.field_2._M_allocated_capacity;
          aStack_e8._0_8_ = local_80.field_2._8_8_;
          _Var9._M_p = (pointer)(local_100 + 0x10);
        }
        else {
          local_100._0_8_ = local_80._M_dataplus._M_p;
          local_100._16_8_ = local_80.field_2._M_allocated_capacity;
          _Var9._M_p = local_80._M_dataplus._M_p;
        }
        local_100._16_8_ = local_80.field_2._M_allocated_capacity;
        paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&__return_storage_ptr__->field_0 = paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_100 + 0x10)) {
          paVar2->_M_allocated_capacity = local_80.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
               aStack_e8._0_8_;
        }
        else {
          (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = _Var9._M_p;
          (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
               local_80.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_80._M_string_length
        ;
        __return_storage_ptr__->has_value_ = false;
LAB_00149663:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._0_8_ != &aStack_b0) {
          operator_delete((void *)local_c0._0_8_,aStack_b0._M_allocated_capacity + 1);
        }
        if (local_108 == true) goto LAB_001494e1;
        goto LAB_00149690;
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
      ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,yaml::Value>,std::_Select1st<std::pair<std::__cxx11::string_const,yaml::Value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yaml::Value>>>
                  *)&local_60.value_,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != &aStack_b0) {
      operator_delete((void *)local_c0._0_8_,aStack_b0._M_allocated_capacity + 1);
    }
    if (local_108 == true) {
      _Var4._M_p = _Var7._M_p;
      _Var11._M_p = (pointer)local_130._8_8_;
      if ((pointer)local_130._8_8_ != _Var7._M_p) {
LAB_001491d9:
        operator_delete(_Var11._M_p,*(size_type *)_Var4._M_p + 1);
      }
    }
    else {
      _Var4._M_p = local_120;
      _Var11._M_p = (pointer)local_130._0_8_;
      if ((pointer)local_130._0_8_ != _Var4._M_p) goto LAB_001491d9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 "Error while reading mapping: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  if (local_c8 == (undefined1  [8])(local_c0 + 8)) {
    local_120._0_8_ = local_c0._8_8_;
    local_120._8_8_ = aStack_b0._M_allocated_capacity;
    auVar8 = (undefined1  [8])local_120;
  }
  else {
    local_130._0_8_ = local_c8;
    local_120._0_8_ = local_c0._8_8_;
    auVar8 = local_c8;
  }
  local_120._0_8_ = local_c0._8_8_;
  paVar2 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&__return_storage_ptr__->field_0 = paVar2;
  if (auVar8 == (undefined1  [8])local_120) {
    paVar2->_M_allocated_capacity = local_c0._8_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
         local_120._8_8_;
  }
  else {
    (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)auVar8;
    (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity = local_c0._8_8_;
  }
  (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_c0._0_8_;
  __return_storage_ptr__->has_value_ = false;
  if ((local_d8 & 1) == 0) {
LAB_001493b7:
    _Var9._M_p = local_100 + 0x10;
    _Var7._M_p = (pointer)local_100._0_8_;
    if ((pointer)local_100._0_8_ == _Var9._M_p) goto LAB_001493d4;
  }
  else {
LAB_00149489:
    _Var7._M_p = (pointer)local_100._8_8_;
    if ((pointer)local_100._8_8_ == _Var9._M_p) goto LAB_001493d4;
  }
  operator_delete(_Var7._M_p,*(size_type *)_Var9._M_p + 1);
LAB_001493d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
LAB_001496d6:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
               *)&local_60.value_);
  return __return_storage_ptr__;
}

Assistant:

Expected<Mapping, std::string> readMapping() {
		Mapping mapping;
		for (;;) {
			std::string key;
			{
				auto event_result = getNextEvent();
				if (!event_result)
					return Unexpected("Error while reading mapping: " + event_result.error());
				YamlEvent event = std::move(event_result).value();

				switch (event.type) {
					case YAML_SCALAR_EVENT:
						MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
						key = std::move(event.value);
						break;
					case YAML_MAPPING_END_EVENT:
						MSG("YAML_MAPPING_END_EVENT");
						return mapping;
					default:
						return Unexpected(format("Unexpected event %d", event.type));
					}
			}

			{
				auto event_result = getNextEvent();
				if (!event_result)
					return Unexpected("Error while reading mapping: " + event_result.error());
				YamlEvent event = std::move(event_result).value();

				switch (event.type) {
					case YAML_SCALAR_EVENT:
						MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
						mapping.map_.emplace(std::move(key), std::move(event.value));
						break;
					case YAML_SEQUENCE_START_EVENT:
						MSG("YAML_SEQUENCE_START_EVENT");
						{
							auto result = readSequence();
							if (!result)
								return Unexpected(result.error());
							mapping.map_.emplace(std::move(key), std::move(result).value());
						}
						break;
					case YAML_MAPPING_START_EVENT:
						MSG("YAML_MAPPING_START_EVENT");
						{
							auto result = readMapping();
							if (!result)
								return Unexpected(result.error());
							mapping.map_.emplace(std::move(key), std::move(result).value());
						}
						break;
					default:
						return Unexpected(format("Unexpected event %d", event.type));
				}
			}
		}
	}